

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.hpp
# Opt level: O1

value_type * __thiscall
poplar::
map<poplar::plain_bonsai_trie<90U,_poplar::hash::vigna_hasher>,_poplar::plain_bonsai_nlm<int>_>::
find(map<poplar::plain_bonsai_trie<90U,_poplar::hash::vigna_hasher>,_poplar::plain_bonsai_nlm<int>_>
     *this,char_range key)

{
  __uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true> _Var1;
  bool bVar2;
  uint64_t node_id;
  undefined8 *puVar3;
  value_type *pvVar4;
  char *pcVar5;
  byte *pbVar6;
  ulong uVar7;
  _Head_base<0UL,_unsigned_char_*,_false> unaff_RBP;
  ulong uVar8;
  byte *pbVar9;
  
  pbVar6 = key.end;
  pbVar9 = key.begin;
  if (pbVar9 == pbVar6) {
    puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
    *puVar3 = &PTR__exception_00108d90;
    pcVar5 = 
    "/workspace/llm4binary/github/license_c_cmakelists/kampersanda[P]poplar-trie/include/poplar/map.hpp:76:key must be a non-empty string."
    ;
  }
  else {
    if (pbVar6[-1] == 0) {
      if ((this->is_ready_ == true) && ((this->hash_trie_).size_ != 0)) {
        node_id = 1;
        do {
          if (pbVar9 == pbVar6) {
            return (value_type *)
                   (_Head_base<0UL,_unsigned_char_*,_false>)
                   *(_Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_> *)
                    &(this->label_store_).ptrs_.
                     super__Vector_base<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[node_id]._M_t.
                     super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>;
          }
          _Var1.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
          super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
          super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
               (this->label_store_).ptrs_.
               super__Vector_base<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[node_id]._M_t.
               super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>;
          uVar8 = (long)pbVar6 - (long)pbVar9;
          if (uVar8 != 0) {
            uVar7 = 0;
            do {
              if (pbVar9[uVar7] !=
                  *(byte *)((long)_Var1.
                                  super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                                  .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl +
                           uVar7)) {
                pvVar4 = (value_type *)0x0;
                goto LAB_00105527;
              }
              uVar7 = uVar7 + 1;
            } while (uVar8 != uVar7);
          }
          pvVar4 = (value_type *)
                   ((long)_Var1.
                          super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                          .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + uVar8);
          uVar7 = uVar8;
LAB_00105527:
          if (pvVar4 == (value_type *)0x0) {
            pbVar9 = pbVar9 + uVar7;
            if (this->lambda_ <= uVar7) {
              do {
                node_id = plain_bonsai_trie<90U,_poplar::hash::vigna_hasher>::find_child
                                    (&this->hash_trie_,node_id,0xff);
                if (node_id == 0xffffffffffffffff) goto LAB_00105596;
                uVar7 = uVar7 - this->lambda_;
              } while (this->lambda_ <= uVar7);
            }
            uVar8 = (ulong)(this->codes_)._M_elems[*pbVar9];
            if (uVar8 != 0xff) {
              node_id = plain_bonsai_trie<90U,_poplar::hash::vigna_hasher>::find_child
                                  (&this->hash_trie_,node_id,uVar7 << 8 | uVar8);
              if (node_id != 0xffffffffffffffff) {
                pbVar9 = pbVar9 + 1;
                bVar2 = true;
                goto LAB_001055a1;
              }
LAB_00105596:
              node_id = 0xffffffffffffffff;
            }
            bVar2 = false;
            unaff_RBP._M_head_impl = (uchar *)0x0;
          }
          else {
            bVar2 = false;
            unaff_RBP._M_head_impl = (uchar *)pvVar4;
          }
LAB_001055a1:
        } while (bVar2);
      }
      else {
        unaff_RBP._M_head_impl = (uchar *)0x0;
      }
      return (value_type *)
             (_Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>)
             unaff_RBP._M_head_impl;
    }
    puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
    *puVar3 = &PTR__exception_00108d90;
    pcVar5 = 
    "/workspace/llm4binary/github/license_c_cmakelists/kampersanda[P]poplar-trie/include/poplar/map.hpp:77:The last character of key must be the null terminator."
    ;
  }
  puVar3[1] = pcVar5;
  __cxa_throw(puVar3,&exception::typeinfo,std::exception::~exception);
}

Assistant:

explicit map(uint32_t capa_bits, uint64_t lambda = 32) {
        POPLAR_THROW_IF(!is_power2(lambda), "lambda must be a power of 2.");

        is_ready_ = true;
        lambda_ = lambda;
        hash_trie_ = Trie{capa_bits, 8 + bit_tools::ceil_log2(lambda_)};
        label_store_ = NLM{hash_trie_.capa_bits()};
        codes_.fill(UINT8_MAX);
        codes_[0] = static_cast<uint8_t>(num_codes_++);  // terminator
    }